

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::MemPass::RemovePhiOperands
          (MemPass *this,Instruction *phi,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *reachable_blocks)

{
  IRContext *pIVar1;
  CFG *pCVar2;
  mapped_type pBVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  uint32_t uVar6;
  ulong uVar7;
  mapped_type *ppBVar8;
  Instruction *instr;
  BasicBlock *pBVar9;
  __node_base_ptr p_Var10;
  uint uVar11;
  pointer pOVar12;
  __node_base_ptr p_Var13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> keep_operands;
  _Type local_ac;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_a8;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *local_90;
  undefined1 local_88 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_60;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  local_a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar12 = (phi->operands_).
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(phi->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar12 >> 4) *
          -0x5555555555555555;
  local_90 = reachable_blocks;
  if ((int)uVar7 != 0) {
    local_ac[0] = '\0';
    local_ac[1] = '\0';
    local_ac[2] = '\0';
    local_ac[3] = '\0';
    uVar11 = 0;
    do {
      uVar14 = (ulong)uVar11;
      uVar15 = 2;
      if (2 < uVar11) {
        uVar15 = (ulong)uVar11;
      }
      if (uVar11 < 2) {
        lVar16 = uVar14 * 0x30;
        do {
          if (uVar7 <= uVar14) goto LAB_005c1b5d;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    (&local_a8,
                     (value_type *)((long)((pOVar12->words).buffer + 0xfffffffffffffffa) + lVar16));
          uVar14 = uVar14 + 1;
          pOVar12 = (phi->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = ((long)(phi->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar12 >> 4) *
                  -0x5555555555555555;
          if ((uVar7 & 0xffffffff) <= uVar14) goto LAB_005c1b17;
          lVar16 = lVar16 + 0x30;
        } while (uVar15 != uVar14);
      }
      if (((uVar14 & 1) != 0) || (uVar11 = (uint)uVar14, (int)uVar7 - 1U <= uVar11)) {
        __assert_fail("i % 2 == 0 && i < phi->NumOperands() - 1 && \"malformed Phi arguments\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp"
                      ,0x163,
                      "void spvtools::opt::MemPass::RemovePhiOperands(Instruction *, const std::unordered_set<BasicBlock *> &)"
                     );
      }
      pIVar1 = (this->super_Pass).context_;
      if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar1);
      }
      pCVar2 = (pIVar1->cfg_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
               _M_t.
               super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
               .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
      local_88._0_4_ = Instruction::GetSingleWordOperand(phi,uVar11 | 1);
      ppBVar8 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&pCVar2->id2block_,(key_type *)local_88);
      pBVar3 = *ppBVar8;
      uVar7 = (local_90->_M_h)._M_bucket_count;
      uVar15 = (ulong)pBVar3 % uVar7;
      p_Var4 = (local_90->_M_h)._M_buckets[uVar15];
      p_Var10 = (__node_base_ptr)0x0;
      if ((p_Var4 != (__node_base_ptr)0x0) &&
         (p_Var10 = p_Var4, p_Var13 = p_Var4->_M_nxt,
         pBVar3 != (mapped_type)p_Var4->_M_nxt[1]._M_nxt)) {
        while (p_Var5 = p_Var13->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
          p_Var10 = (__node_base_ptr)0x0;
          if (((ulong)p_Var5[1]._M_nxt % uVar7 != uVar15) ||
             (p_Var10 = p_Var13, p_Var13 = p_Var5, pBVar3 == (mapped_type)p_Var5[1]._M_nxt))
          goto LAB_005c18d6;
        }
        p_Var10 = (__node_base_ptr)0x0;
      }
LAB_005c18d6:
      if ((p_Var10 != (__node_base_ptr)0x0) && (p_Var10->_M_nxt != (_Hash_node_base *)0x0)) {
        uVar6 = Instruction::GetSingleWordOperand(phi,uVar11);
        pIVar1 = (this->super_Pass).context_;
        if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar1);
        }
        instr = analysis::DefUseManager::GetDef
                          ((pIVar1->def_use_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                           _M_head_impl,uVar6);
        pBVar9 = IRContext::get_instr_block((this->super_Pass).context_,instr);
        if (pBVar9 == (BasicBlock *)0x0) {
LAB_005c19ab:
          uVar14 = uVar14 & 0xffffffff;
          pOVar12 = (phi->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = ((long)(phi->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar12 >> 4) *
                  -0x5555555555555555;
          if (uVar7 < uVar14 || uVar7 - uVar14 == 0) goto LAB_005c1b5d;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                    (&local_a8,pOVar12 + uVar14);
        }
        else {
          uVar7 = (local_90->_M_h)._M_bucket_count;
          uVar15 = (ulong)pBVar9 % uVar7;
          p_Var4 = (local_90->_M_h)._M_buckets[uVar15];
          p_Var10 = (__node_base_ptr)0x0;
          if ((p_Var4 != (__node_base_ptr)0x0) &&
             (p_Var10 = p_Var4, p_Var13 = p_Var4->_M_nxt,
             pBVar9 != (BasicBlock *)p_Var4->_M_nxt[1]._M_nxt)) {
            while (p_Var5 = p_Var13->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
              p_Var10 = (__node_base_ptr)0x0;
              if (((ulong)p_Var5[1]._M_nxt % uVar7 != uVar15) ||
                 (p_Var10 = p_Var13, p_Var13 = p_Var5, pBVar9 == (BasicBlock *)p_Var5[1]._M_nxt))
              goto LAB_005c19a0;
            }
            p_Var10 = (__node_base_ptr)0x0;
          }
LAB_005c19a0:
          if ((p_Var10 != (__node_base_ptr)0x0) && (p_Var10->_M_nxt != (_Hash_node_base *)0x0))
          goto LAB_005c19ab;
          if (local_ac == (_Type)0x0) {
            uVar6 = 0;
            if (instr->has_type_id_ == true) {
              uVar6 = Instruction::GetSingleWordOperand(instr,0);
            }
            local_ac = (_Type)Type2Undef(this,uVar6);
          }
          local_58._0_8_ = &PTR__SmallVector_00b15d78;
          local_58._24_8_ = local_58 + 0x10;
          local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_58._8_8_ = 1;
          local_88._0_4_ = SPV_OPERAND_TYPE_ID;
          local_88._8_8_ = &PTR__SmallVector_00b15d78;
          local_88._16_8_ = 0;
          local_88._32_8_ = local_88 + 0x18;
          local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_58._16_4_ = local_ac;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_88 + 8),
                     (SmallVector<unsigned_int,_2UL> *)local_58);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>(&local_a8,(Operand *)local_88);
          local_88._8_8_ = &PTR__SmallVector_00b15d78;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_60._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
          {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_60,local_60._M_head_impl);
          }
          local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_58._0_8_ = &PTR__SmallVector_00b15d78;
          if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_38,local_38._M_head_impl);
          }
        }
        uVar7 = (ulong)(uVar11 | 1);
        pOVar12 = (phi->operands_).
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar14 = ((long)(phi->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar12 >> 4) *
                 -0x5555555555555555;
        if (uVar14 < uVar7 || uVar14 - uVar7 == 0) {
LAB_005c1b5d:
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  (&local_a8,pOVar12 + uVar7);
      }
      uVar11 = uVar11 + 2;
      pOVar12 = (phi->operands_).
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(phi->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar12 >> 4) *
              -0x5555555555555555;
    } while (uVar11 < (uint)uVar7);
  }
LAB_005c1b17:
  IRContext::ForgetUses((this->super_Pass).context_,phi);
  Instruction::ReplaceOperands(phi,&local_a8);
  IRContext::AnalyzeUses((this->super_Pass).context_,phi);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_a8);
  return;
}

Assistant:

void MemPass::RemovePhiOperands(
    Instruction* phi, const std::unordered_set<BasicBlock*>& reachable_blocks) {
  std::vector<Operand> keep_operands;
  uint32_t type_id = 0;
  // The id of an undefined value we've generated.
  uint32_t undef_id = 0;

  // Traverse all the operands in |phi|. Build the new operand vector by adding
  // all the original operands from |phi| except the unwanted ones.
  for (uint32_t i = 0; i < phi->NumOperands();) {
    if (i < 2) {
      // The first two arguments are always preserved.
      keep_operands.push_back(phi->GetOperand(i));
      ++i;
      continue;
    }

    // The remaining Phi arguments come in pairs. Index 'i' contains the
    // variable id, index 'i + 1' is the originating block id.
    assert(i % 2 == 0 && i < phi->NumOperands() - 1 &&
           "malformed Phi arguments");

    BasicBlock* in_block = cfg()->block(phi->GetSingleWordOperand(i + 1));
    if (reachable_blocks.find(in_block) == reachable_blocks.end()) {
      // If the incoming block is unreachable, remove both operands as this
      // means that the |phi| has lost an incoming edge.
      i += 2;
      continue;
    }

    // In all other cases, the operand must be kept but may need to be changed.
    uint32_t arg_id = phi->GetSingleWordOperand(i);
    Instruction* arg_def_instr = get_def_use_mgr()->GetDef(arg_id);
    BasicBlock* def_block = context()->get_instr_block(arg_def_instr);
    if (def_block &&
        reachable_blocks.find(def_block) == reachable_blocks.end()) {
      // If the current |phi| argument was defined in an unreachable block, it
      // means that this |phi| argument is no longer defined. Replace it with
      // |undef_id|.
      if (!undef_id) {
        type_id = arg_def_instr->type_id();
        undef_id = Type2Undef(type_id);
      }
      keep_operands.push_back(
          Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {undef_id}));
    } else {
      // Otherwise, the argument comes from a reachable block or from no block
      // at all (meaning that it was defined in the global section of the
      // program).  In both cases, keep the argument intact.
      keep_operands.push_back(phi->GetOperand(i));
    }

    keep_operands.push_back(phi->GetOperand(i + 1));

    i += 2;
  }

  context()->ForgetUses(phi);
  phi->ReplaceOperands(keep_operands);
  context()->AnalyzeUses(phi);
}